

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execAdda<(moira::Instr)119,(moira::Mode)6,(moira::Size)2>(Moira *this,u16 opcode)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  ulong uVar4;
  u32 data;
  u32 ea;
  
  _data = in_RAX;
  bVar2 = readOp<(moira::Mode)6,(moira::Size)2,128ul>(this,opcode & 7,&ea,&data);
  if (bVar2) {
    uVar4 = (ulong)(opcode >> 9 & 7);
    iVar3 = (int)(short)data;
    _data = CONCAT44(ea,iVar3);
    iVar1 = *(int *)((long)this->exec + uVar4 * 4 + -0x38);
    prefetch<4ul>(this);
    (*this->_vptr_Moira[0x19])(this,2);
    (*this->_vptr_Moira[0x19])(this,2);
    *(int *)((long)this->exec + uVar4 * 4 + -0x38) = iVar1 - iVar3;
  }
  return;
}

Assistant:

void
Moira::execAdda(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    data = SEXT<S>(data);

    result = (I == ADDA) ? readA(dst) + data : readA(dst) - data;
    prefetch<POLLIPL>();

    sync(2);
    if (S == Word || isRegMode(M) || isImmMode(M)) sync(2);
    writeA(dst, result);
}